

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD2Loader.cpp
# Opt level: O1

void __thiscall
Assimp::MD2Importer::InternReadFile
          (MD2Importer *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  float *pfVar1;
  byte bVar2;
  ushort uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  Header *pHVar7;
  Header *pHVar8;
  long lVar9;
  long lVar10;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  undefined4 extraout_var;
  aiNode *this_00;
  uint *puVar16;
  aiMaterial **ppaVar17;
  aiMaterial *paVar18;
  aiMesh **ppaVar19;
  aiMesh *paVar20;
  ulong *puVar21;
  aiFace *paVar22;
  aiVector3D *paVar23;
  size_t sVar24;
  Logger *pLVar25;
  ulong uVar26;
  long *plVar27;
  runtime_error *prVar28;
  aiFace *paVar29;
  long *plVar30;
  aiVector3D *vOut;
  ulong uVar31;
  long lVar32;
  char *pcVar33;
  ulong uVar34;
  float fVar35;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mBuffer2;
  aiColor3D clr_1;
  int iMode;
  aiString szString;
  aiColor3D clr;
  float local_8bc;
  long local_8b8;
  float local_8ac;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_870;
  ulong local_858;
  undefined8 local_850;
  undefined4 local_848;
  undefined4 local_844;
  aiString local_840;
  aiString local_438;
  ulong uVar11;
  
  pcVar33 = local_840.data + 0xc;
  local_840._0_8_ = pcVar33;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_840,"rb","");
  iVar12 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_840._0_8_);
  plVar27 = (long *)CONCAT44(extraout_var,iVar12);
  if ((char *)local_840._0_8_ != pcVar33) {
    operator_delete((void *)local_840._0_8_,
                    CONCAT44(local_840.data._16_4_,local_840.data._12_4_) + 1);
  }
  if (plVar27 == (long *)0x0) {
    prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_438,
                   "Failed to open MD2 file ",pFile);
    plVar27 = (long *)std::__cxx11::string::append((char *)&local_438);
    local_840._0_8_ = *plVar27;
    plVar30 = plVar27 + 2;
    if ((long *)local_840._0_8_ == plVar30) {
      local_840.data._20_8_ = plVar27[3];
      local_840.data._12_4_ = SUB84(*plVar30,0);
      local_840.data._16_4_ = SUB84((ulong)*plVar30 >> 0x20,0);
      local_840._0_8_ = pcVar33;
    }
    else {
      local_840.data._12_4_ = SUB84(*plVar30,0);
      local_840.data._16_4_ = SUB84((ulong)*plVar30 >> 0x20,0);
    }
    local_840.data._4_4_ = SUB84(plVar27[1],0);
    local_840.data._8_4_ = SUB84((ulong)plVar27[1] >> 0x20,0);
    *plVar27 = (long)plVar30;
    plVar27[1] = 0;
    *(undefined1 *)(plVar27 + 2) = 0;
    std::runtime_error::runtime_error(prVar28,(string *)&local_840);
    *(undefined ***)prVar28 = &PTR__runtime_error_008e3168;
    __cxa_throw(prVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar13 = (**(code **)(*plVar27 + 0x30))();
  this->fileSize = uVar13;
  if ((uVar13 & 0xfffffffc) < 0x44) {
    prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_840._0_8_ = pcVar33;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_840,"MD2 File is too small","")
    ;
    std::runtime_error::runtime_error(prVar28,(string *)&local_840);
    *(undefined ***)prVar28 = &PTR__runtime_error_008e3168;
    __cxa_throw(prVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_870,(ulong)uVar13,(allocator_type *)&local_840);
  (**(code **)(*plVar27 + 0x10))
            (plVar27,local_870.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,1,this->fileSize);
  this->mBuffer =
       local_870.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  this->m_pcHeader =
       (Header *)
       local_870.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  ValidateHeader(this);
  pScene->mNumMaterials = 1;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  pScene->mRootNode = this_00;
  this_00->mNumMeshes = 1;
  puVar16 = (uint *)operator_new__(4);
  this_00->mMeshes = puVar16;
  *puVar16 = 0;
  ppaVar17 = (aiMaterial **)operator_new__(8);
  pScene->mMaterials = ppaVar17;
  paVar18 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar18);
  *pScene->mMaterials = paVar18;
  pScene->mNumMeshes = 1;
  ppaVar19 = (aiMesh **)operator_new__(8);
  pScene->mMeshes = ppaVar19;
  paVar20 = (aiMesh *)operator_new(0x520);
  paVar20->mPrimitiveTypes = 0;
  paVar20->mNumVertices = 0;
  paVar20->mNumFaces = 0;
  memset(&paVar20->mVertices,0,0xcc);
  paVar20->mBones = (aiBone **)0x0;
  paVar20->mMaterialIndex = 0;
  (paVar20->mName).length = 0;
  (paVar20->mName).data[0] = '\0';
  memset((paVar20->mName).data + 1,0x1b,0x3ff);
  paVar20->mNumAnimMeshes = 0;
  paVar20->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar20->mMethod = 0;
  (paVar20->mAABB).mMin.x = 0.0;
  (paVar20->mAABB).mMin.y = 0.0;
  (paVar20->mAABB).mMin.z = 0.0;
  (paVar20->mAABB).mMax.x = 0.0;
  (paVar20->mAABB).mMax.y = 0.0;
  (paVar20->mAABB).mMax.z = 0.0;
  paVar20->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar20->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar20->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar20->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar20->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar20->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar20->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar20->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar20->mNumUVComponents[0] = 0;
  paVar20->mNumUVComponents[1] = 0;
  paVar20->mNumUVComponents[2] = 0;
  paVar20->mNumUVComponents[3] = 0;
  paVar20->mNumUVComponents[4] = 0;
  paVar20->mNumUVComponents[5] = 0;
  paVar20->mNumUVComponents[6] = 0;
  paVar20->mNumUVComponents[7] = 0;
  paVar20->mColors[0] = (aiColor4D *)0x0;
  paVar20->mColors[1] = (aiColor4D *)0x0;
  paVar20->mColors[2] = (aiColor4D *)0x0;
  paVar20->mColors[3] = (aiColor4D *)0x0;
  paVar20->mColors[4] = (aiColor4D *)0x0;
  paVar20->mColors[5] = (aiColor4D *)0x0;
  paVar20->mColors[6] = (aiColor4D *)0x0;
  paVar20->mColors[7] = (aiColor4D *)0x0;
  *ppaVar19 = paVar20;
  paVar20->mPrimitiveTypes = 4;
  pHVar7 = this->m_pcHeader;
  uVar13 = pHVar7->offsetFrames;
  uVar14 = this->configFrameID;
  uVar4 = pHVar7->frameSize;
  uVar15 = pHVar7->offsetTriangles;
  uVar5 = pHVar7->numTriangles;
  uVar6 = pHVar7->offsetTexCoords;
  paVar20->mNumFaces = uVar5;
  uVar31 = (ulong)pHVar7->numTriangles;
  puVar21 = (ulong *)operator_new__(uVar31 * 0x10 + 8);
  *puVar21 = uVar31;
  paVar22 = (aiFace *)(puVar21 + 1);
  if (uVar31 != 0) {
    paVar29 = paVar22;
    do {
      paVar29->mNumIndices = 0;
      paVar29->mIndices = (uint *)0x0;
      paVar29 = paVar29 + 1;
    } while (paVar29 != paVar22 + uVar31);
  }
  paVar20->mFaces = paVar22;
  uVar31 = (ulong)(uVar5 * 3);
  paVar20->mNumVertices = uVar5 * 3;
  paVar23 = (aiVector3D *)operator_new__(uVar31 * 0xc);
  if (uVar5 != 0) {
    memset(paVar23,0,((uVar31 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar20->mVertices = paVar23;
  paVar23 = (aiVector3D *)operator_new__(uVar31 * 0xc);
  if (uVar5 != 0) {
    memset(paVar23,0,((uVar31 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  paVar20->mNormals = paVar23;
  paVar18 = *pScene->mMaterials;
  local_844 = 2;
  aiMaterial::AddBinaryProperty(paVar18,&local_844,4,"$mat.shadingm",0,0,aiPTI_Integer);
  pHVar8 = this->m_pcHeader;
  if ((pHVar8->numTexCoords == 0) || (pHVar8->numSkins == 0)) {
    local_850 = 0x3f19999a3f19999a;
    local_848 = 0x3f19999a;
    aiMaterial::AddBinaryProperty(paVar18,&local_850,0xc,"$clr.diffuse",0,0,aiPTI_Float);
    aiMaterial::AddBinaryProperty(paVar18,&local_850,0xc,"$clr.specular",0,0,aiPTI_Float);
    local_850 = 0x3d4ccccd3d4ccccd;
    local_848 = 0x3d4ccccd;
    aiMaterial::AddBinaryProperty(paVar18,&local_850,0xc,"$clr.ambient",0,0,aiPTI_Float);
    local_840.length = 0;
    local_840.data._0_4_ = local_840.data._0_4_ & 0xffffff00;
    memset((void *)((long)&local_840 + 5),0x1b,0x3ff);
    local_840.length = 0xf;
    builtin_strncpy(local_840.data,"DefaultMaterial",0x10);
    aiMaterial::AddProperty(paVar18,&local_840,"?mat.name",0,0);
    local_438.length = 0;
    local_438.data._0_4_ = local_438.data._0_4_ & 0xffffff00;
    memset(local_438.data + 1,0x1b,0x3ff);
    local_438.length = 0x12;
    builtin_strncpy(local_438.data,"$texture_dummy.bmp",0x13);
    aiMaterial::AddProperty(paVar18,&local_438,"$tex.file",1,0);
  }
  else {
    uVar5 = pHVar8->offsetSkins;
    local_438.data[0] = '\0';
    local_438.data[1] = '\0';
    local_438.data[2] = -0x80;
    local_438.data[3] = '?';
    local_438.length = 0x3f800000;
    local_438.data[4] = '\0';
    local_438.data[5] = '\0';
    local_438.data[6] = -0x80;
    local_438.data[7] = '?';
    aiMaterial::AddBinaryProperty(paVar18,&local_438,0xc,"$clr.diffuse",0,0,aiPTI_Float);
    aiMaterial::AddBinaryProperty(paVar18,&local_438,0xc,"$clr.specular",0,0,aiPTI_Float);
    local_438.length = 0x3d4ccccd;
    local_438.data[0] = -0x33;
    local_438.data[1] = -0x34;
    local_438.data[2] = 'L';
    local_438.data[3] = '=';
    local_438.data[4] = -0x33;
    local_438.data[5] = -0x34;
    local_438.data[6] = 'L';
    local_438.data[7] = '=';
    aiMaterial::AddBinaryProperty(paVar18,&local_438,0xc,"$clr.ambient",0,0,aiPTI_Float);
    pcVar33 = (char *)((long)&pHVar8->magic + (ulong)uVar5);
    if (*pcVar33 == '\0') {
      pLVar25 = DefaultLogger::get();
      Logger::warn(pLVar25,"Texture file name has zero length. It will be skipped.");
      goto LAB_004458d4;
    }
    local_840.length = 0;
    local_840.data._0_4_ = local_840.data._0_4_ & 0xffffff00;
    memset((void *)((long)&local_840 + 5),0x1b,0x3ff);
    sVar24 = strlen(pcVar33);
    memcpy((void *)((long)&local_840 + 4),pcVar33,sVar24 & 0xffffffff);
    *(undefined1 *)((long)&local_840 + (sVar24 & 0xffffffff) + 4) = 0;
    local_840.length = (ai_uint32)sVar24;
    aiMaterial::AddProperty(paVar18,&local_840,"$tex.file",1,0);
  }
LAB_004458d4:
  pHVar8 = this->m_pcHeader;
  local_8ac = 1.0;
  if (pHVar8->numTexCoords == 0) {
    local_8bc = 1.0;
  }
  else {
    uVar31 = (ulong)paVar20->mNumVertices;
    paVar23 = (aiVector3D *)operator_new__(uVar31 * 0xc);
    if (uVar31 != 0) {
      memset(paVar23,0,((uVar31 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar20->mTextureCoords[0] = paVar23;
    paVar20->mNumUVComponents[0] = 2;
    uVar5 = pHVar8->skinWidth;
    if (uVar5 == 0) {
      pLVar25 = DefaultLogger::get();
      Logger::error(pLVar25,"MD2: No valid skin width given");
      local_8bc = 1.0;
    }
    else {
      local_8bc = (float)uVar5;
    }
    uVar5 = this->m_pcHeader->skinHeight;
    if (uVar5 == 0) {
      pLVar25 = DefaultLogger::get();
      Logger::error(pLVar25,"MD2: No valid skin height given");
    }
    else {
      local_8ac = (float)uVar5;
    }
  }
  if (this->m_pcHeader->numTriangles != 0) {
    pfVar1 = (float *)((long)&pHVar7->magic + (ulong)(uVar14 * uVar4) + (ulong)uVar13);
    local_8b8 = (long)&pHVar7->version + (ulong)uVar15 + 2;
    uVar31 = 0;
    uVar13 = 0;
    do {
      puVar16 = (uint *)operator_new__(0xc);
      (*pScene->mMeshes)->mFaces[uVar31].mIndices = puVar16;
      (*pScene->mMeshes)->mFaces[uVar31].mNumIndices = 3;
      lVar32 = 0;
      local_858 = uVar31;
      do {
        uVar3 = *(ushort *)(local_8b8 + -6 + lVar32 * 2);
        uVar14 = (uint)uVar3;
        if (this->m_pcHeader->numVertices <= (uint)uVar3) {
          pLVar25 = DefaultLogger::get();
          Logger::error(pLVar25,"MD2: Vertex index is outside the allowed range");
          uVar14 = this->m_pcHeader->numVertices - 1;
        }
        paVar23 = paVar20->mVertices;
        uVar34 = (ulong)uVar13 + lVar32 & 0xffffffff;
        uVar26 = (ulong)uVar14;
        bVar2 = *(byte *)(pfVar1 + uVar26 + 10);
        fVar35 = *pfVar1;
        paVar23[uVar34].x = (float)bVar2 * fVar35;
        paVar23[uVar34].x = (float)bVar2 * fVar35 + pfVar1[3];
        fVar35 = (float)*(byte *)((long)pfVar1 + uVar26 * 4 + 0x29) * pfVar1[1];
        paVar23[uVar34].y = fVar35;
        paVar23[uVar34].y = fVar35 + pfVar1[4];
        fVar35 = (float)*(byte *)((long)pfVar1 + uVar26 * 4 + 0x2a) * pfVar1[2];
        paVar23[uVar34].z = fVar35;
        paVar23[uVar34].z = fVar35 + pfVar1[5];
        vOut = paVar20->mNormals + uVar34;
        MD2::LookupNormalIndex(*(uint8_t *)((long)pfVar1 + uVar26 * 4 + 0x2b),vOut);
        lVar9._0_4_ = vOut->y;
        lVar9._4_4_ = vOut->z;
        uVar26._0_4_ = vOut->y;
        uVar26._4_4_ = vOut->z;
        uVar26 = lVar9 << 0x20 | uVar26 >> 0x20;
        vOut->y = (float)(int)uVar26;
        vOut->z = (float)(int)(uVar26 >> 0x20);
        paVar23 = paVar23 + uVar34;
        lVar10._0_4_ = paVar23->y;
        lVar10._4_4_ = paVar23->z;
        uVar11._0_4_ = paVar23->y;
        uVar11._4_4_ = paVar23->z;
        uVar26 = lVar10 << 0x20 | uVar11 >> 0x20;
        paVar23->y = (float)(int)uVar26;
        paVar23->z = (float)(int)(uVar26 >> 0x20);
        uVar14 = this->m_pcHeader->numTexCoords;
        if (uVar14 != 0) {
          uVar3 = *(ushort *)(local_8b8 + lVar32 * 2);
          uVar15 = (uint)uVar3;
          if (uVar14 <= uVar3) {
            pLVar25 = DefaultLogger::get();
            Logger::error(pLVar25,"MD2: UV index is outside the allowed range");
            uVar15 = this->m_pcHeader->numTexCoords - 1;
          }
          paVar23 = paVar20->mTextureCoords[0];
          paVar23[uVar34].x =
               (float)*(ushort *)((long)&pHVar7->magic + (ulong)uVar15 * 4 + (ulong)uVar6) /
               local_8bc;
          paVar23[uVar34].y =
               1.0 - (float)*(ushort *)((long)&pHVar7->magic + (ulong)uVar15 * 4 + (ulong)uVar6 + 2)
                     / local_8ac;
        }
        (*pScene->mMeshes)->mFaces[uVar31].mIndices[lVar32] = (uint)((ulong)uVar13 + lVar32);
        lVar32 = lVar32 + 1;
      } while (lVar32 != 3);
      uVar31 = local_858 + 1;
      local_8b8 = local_8b8 + 0xc;
      uVar13 = uVar13 + 3;
    } while (uVar31 < this->m_pcHeader->numTriangles);
  }
  if ((Header *)
      local_870.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (Header *)0x0) {
    operator_delete(local_870.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_870.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_870.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  (**(code **)(*plVar27 + 8))();
  return;
}

Assistant:

void MD2Importer::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open MD2 file " + pFile + "");

    // check whether the md3 file is large enough to contain
    // at least the file header
    fileSize = (unsigned int)file->FileSize();
    if( fileSize < sizeof(MD2::Header))
        throw DeadlyImportError( "MD2 File is too small");

    std::vector<uint8_t> mBuffer2(fileSize);
    file->Read(&mBuffer2[0], 1, fileSize);
    mBuffer = &mBuffer2[0];


    m_pcHeader = (BE_NCONST MD2::Header*)mBuffer;

#ifdef AI_BUILD_BIG_ENDIAN

    ByteSwap::Swap4(&m_pcHeader->frameSize);
    ByteSwap::Swap4(&m_pcHeader->magic);
    ByteSwap::Swap4(&m_pcHeader->numFrames);
    ByteSwap::Swap4(&m_pcHeader->numGlCommands);
    ByteSwap::Swap4(&m_pcHeader->numSkins);
    ByteSwap::Swap4(&m_pcHeader->numTexCoords);
    ByteSwap::Swap4(&m_pcHeader->numTriangles);
    ByteSwap::Swap4(&m_pcHeader->numVertices);
    ByteSwap::Swap4(&m_pcHeader->offsetEnd);
    ByteSwap::Swap4(&m_pcHeader->offsetFrames);
    ByteSwap::Swap4(&m_pcHeader->offsetGlCommands);
    ByteSwap::Swap4(&m_pcHeader->offsetSkins);
    ByteSwap::Swap4(&m_pcHeader->offsetTexCoords);
    ByteSwap::Swap4(&m_pcHeader->offsetTriangles);
    ByteSwap::Swap4(&m_pcHeader->skinHeight);
    ByteSwap::Swap4(&m_pcHeader->skinWidth);
    ByteSwap::Swap4(&m_pcHeader->version);

#endif

    ValidateHeader();

    // there won't be more than one mesh inside the file
    pScene->mNumMaterials = 1;
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mNumMeshes = 1;
    pScene->mRootNode->mMeshes = new unsigned int[1];
    pScene->mRootNode->mMeshes[0] = 0;
    pScene->mMaterials = new aiMaterial*[1];
    pScene->mMaterials[0] = new aiMaterial();
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[1];

    aiMesh* pcMesh = pScene->mMeshes[0] = new aiMesh();
    pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

    // navigate to the begin of the current frame data
	BE_NCONST MD2::Frame* pcFrame = (BE_NCONST MD2::Frame*) ((uint8_t*)
		m_pcHeader + m_pcHeader->offsetFrames + (m_pcHeader->frameSize * configFrameID));

    // navigate to the begin of the triangle data
    MD2::Triangle* pcTriangles = (MD2::Triangle*) ((uint8_t*)
        m_pcHeader + m_pcHeader->offsetTriangles);

    // navigate to the begin of the tex coords data
    BE_NCONST MD2::TexCoord* pcTexCoords = (BE_NCONST MD2::TexCoord*) ((uint8_t*)
        m_pcHeader + m_pcHeader->offsetTexCoords);

    // navigate to the begin of the vertex data
    BE_NCONST MD2::Vertex* pcVerts = (BE_NCONST MD2::Vertex*) (pcFrame->vertices);

#ifdef AI_BUILD_BIG_ENDIAN
    for (uint32_t i = 0; i< m_pcHeader->numTriangles; ++i)
    {
        for (unsigned int p = 0; p < 3;++p)
        {
            ByteSwap::Swap2(& pcTriangles[i].textureIndices[p]);
            ByteSwap::Swap2(& pcTriangles[i].vertexIndices[p]);
        }
    }
    for (uint32_t i = 0; i < m_pcHeader->offsetTexCoords;++i)
    {
        ByteSwap::Swap2(& pcTexCoords[i].s);
        ByteSwap::Swap2(& pcTexCoords[i].t);
    }
    ByteSwap::Swap4( & pcFrame->scale[0] );
    ByteSwap::Swap4( & pcFrame->scale[1] );
    ByteSwap::Swap4( & pcFrame->scale[2] );
    ByteSwap::Swap4( & pcFrame->translate[0] );
    ByteSwap::Swap4( & pcFrame->translate[1] );
    ByteSwap::Swap4( & pcFrame->translate[2] );
#endif

    pcMesh->mNumFaces = m_pcHeader->numTriangles;
    pcMesh->mFaces = new aiFace[m_pcHeader->numTriangles];

    // allocate output storage
    pcMesh->mNumVertices = (unsigned int)pcMesh->mNumFaces*3;
    pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];
    pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];

    // Not sure whether there are MD2 files without texture coordinates
    // NOTE: texture coordinates can be there without a texture,
    // but a texture can't be there without a valid UV channel
    aiMaterial* pcHelper = (aiMaterial*)pScene->mMaterials[0];
    const int iMode = (int)aiShadingMode_Gouraud;
    pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

    if (m_pcHeader->numTexCoords && m_pcHeader->numSkins)
    {
        // navigate to the first texture associated with the mesh
        const MD2::Skin* pcSkins = (const MD2::Skin*) ((unsigned char*)m_pcHeader +
            m_pcHeader->offsetSkins);

        aiColor3D clr;
        clr.b = clr.g = clr.r = 1.0f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        clr.b = clr.g = clr.r = 0.05f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        if (pcSkins->name[0])
        {
            aiString szString;
            const ai_uint32 iLen = (ai_uint32) ::strlen(pcSkins->name);
            ::memcpy(szString.data,pcSkins->name,iLen);
            szString.data[iLen] = '\0';
            szString.length = iLen;

            pcHelper->AddProperty(&szString,AI_MATKEY_TEXTURE_DIFFUSE(0));
        }
        else{
            ASSIMP_LOG_WARN("Texture file name has zero length. It will be skipped.");
        }
    }
    else    {
        // apply a default material
        aiColor3D clr;
        clr.b = clr.g = clr.r = 0.6f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        clr.b = clr.g = clr.r = 0.05f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        aiString szName;
        szName.Set(AI_DEFAULT_MATERIAL_NAME);
        pcHelper->AddProperty(&szName,AI_MATKEY_NAME);

        aiString sz;

        // TODO: Try to guess the name of the texture file from the model file name

        sz.Set("$texture_dummy.bmp");
        pcHelper->AddProperty(&sz,AI_MATKEY_TEXTURE_DIFFUSE(0));
    }


    // now read all triangles of the first frame, apply scaling and translation
    unsigned int iCurrent = 0;

    float fDivisorU = 1.0f,fDivisorV = 1.0f;
    if (m_pcHeader->numTexCoords)   {
        // allocate storage for texture coordinates, too
        pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
        pcMesh->mNumUVComponents[0] = 2;

        // check whether the skin width or height are zero (this would
        // cause a division through zero)
        if (!m_pcHeader->skinWidth) {
            ASSIMP_LOG_ERROR("MD2: No valid skin width given");
        }
        else fDivisorU = (float)m_pcHeader->skinWidth;
        if (!m_pcHeader->skinHeight){
            ASSIMP_LOG_ERROR("MD2: No valid skin height given");
        }
        else fDivisorV = (float)m_pcHeader->skinHeight;
    }

    for (unsigned int i = 0; i < (unsigned int)m_pcHeader->numTriangles;++i)    {
        // Allocate the face
        pScene->mMeshes[0]->mFaces[i].mIndices = new unsigned int[3];
        pScene->mMeshes[0]->mFaces[i].mNumIndices = 3;

        // copy texture coordinates
        // check whether they are different from the previous value at this index.
        // In this case, create a full separate set of vertices/normals/texcoords
        for (unsigned int c = 0; c < 3;++c,++iCurrent)  {

            // validate vertex indices
            unsigned int iIndex = (unsigned int)pcTriangles[i].vertexIndices[c];
            if (iIndex >= m_pcHeader->numVertices)  {
                ASSIMP_LOG_ERROR("MD2: Vertex index is outside the allowed range");
                iIndex = m_pcHeader->numVertices-1;
            }

            // read x,y, and z component of the vertex
            aiVector3D& vec = pcMesh->mVertices[iCurrent];

            vec.x = (float)pcVerts[iIndex].vertex[0] * pcFrame->scale[0];
            vec.x += pcFrame->translate[0];

            vec.y = (float)pcVerts[iIndex].vertex[1] * pcFrame->scale[1];
            vec.y += pcFrame->translate[1];

            vec.z = (float)pcVerts[iIndex].vertex[2] * pcFrame->scale[2];
            vec.z += pcFrame->translate[2];

            // read the normal vector from the precalculated normal table
            aiVector3D& vNormal = pcMesh->mNormals[iCurrent];
            LookupNormalIndex(pcVerts[iIndex].lightNormalIndex,vNormal);

            // flip z and y to become right-handed
            std::swap((float&)vNormal.z,(float&)vNormal.y);
            std::swap((float&)vec.z,(float&)vec.y);

            if (m_pcHeader->numTexCoords)   {
                // validate texture coordinates
                iIndex = pcTriangles[i].textureIndices[c];
                if (iIndex >= m_pcHeader->numTexCoords) {
                    ASSIMP_LOG_ERROR("MD2: UV index is outside the allowed range");
                    iIndex = m_pcHeader->numTexCoords-1;
                }

                aiVector3D& pcOut = pcMesh->mTextureCoords[0][iCurrent];

                // the texture coordinates are absolute values but we
                // need relative values between 0 and 1
                pcOut.x = pcTexCoords[iIndex].s / fDivisorU;
                pcOut.y = 1.f-pcTexCoords[iIndex].t / fDivisorV;
            }
            pScene->mMeshes[0]->mFaces[i].mIndices[c] = iCurrent;
        }
    }
}